

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokens.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Tokens::createWrappedToken
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Tokens *this,Parameters *parameters,TTL *ttl)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Parameters *local_a0;
  Path local_98;
  Url local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  client = *(Client **)this;
  local_c0 = &local_b0;
  local_a0 = parameters;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"create","");
  paVar1 = &local_98.value_.field_2;
  if (local_c0 == &local_b0) {
    local_98.value_.field_2._8_8_ = local_b0._8_8_;
    local_98.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.value_._M_dataplus._M_p = (pointer)local_c0;
  }
  local_98.value_.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_98.value_.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_98.value_._M_string_length = local_b8;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_c0 = &local_b0;
  getUrl(&local_78,this,&local_98);
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<curl_slist_*(curl_slist_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/Tokens.cpp:101:52)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<curl_slist_*(curl_slist_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/Tokens.cpp:101:52)>
             ::_M_manager;
  local_58._M_unused._M_object = ttl;
  HttpConsumer::post(__return_storage_ptr__,client,&local_78,local_a0,
                     (CurlHeaderCallback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.value_._M_dataplus._M_p != &local_78.value_.field_2) {
    operator_delete(local_78.value_._M_dataplus._M_p,
                    local_78.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.value_._M_dataplus._M_p,
                    local_98.value_.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Tokens::createWrappedToken(const Parameters &parameters, const TTL &ttl) {
  return HttpConsumer::post(
      client_, getUrl(Path{"create"}), parameters, [&](curl_slist *chunk) {
        return curl_slist_append(chunk, ("X-Vault-Wrap-TTL: " + ttl).c_str());
      });
}